

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_79::Parser::parseValue(Parser *this,Builder *output)

{
  Input *this_00;
  byte *pbVar1;
  size_t *psVar2;
  char *value;
  undefined2 *puVar3;
  WirePointer *pWVar4;
  double dVar5;
  StructBuilder other;
  StructBuilder other_00;
  Orphan<capnp::json::Value::Field> *pOVar6;
  RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *pRVar7;
  Orphan<capnp::json::Value::Field> *pOVar8;
  SegmentBuilder *pSVar9;
  byte bVar10;
  bool bVar11;
  char cVar12;
  BuilderArena *pBVar13;
  ulong uVar14;
  CapTableBuilder *pCVar15;
  Exception *pEVar16;
  size_t sVar17;
  word wVar18;
  long lVar19;
  unsigned_long i;
  long lVar20;
  long lVar21;
  Reader value_00;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> expected_00;
  ArrayPtr<const_char> expected_01;
  Reader value_01;
  Vector<capnp::Orphan<capnp::json::Value::Field>_> fields;
  DebugExpression<bool> _kjCondition;
  uint7 uStack_e7;
  SegmentBuilder *pSStack_e0;
  WirePointer *local_d8;
  WirePointer *pWStack_d0;
  undefined8 local_c8;
  Fault f;
  DebugExpression<bool> _kjCondition_1;
  undefined7 uStack_7f;
  PointerBuilder local_58;
  size_t *local_40;
  CapTableBuilder *local_38;
  
  this_00 = &this->input;
  Input::consumeWhitespace(this_00);
  if ((this->input).wrapped.size_ == 0) {
    __kjCondition = (ulong)uStack_e7 << 8;
  }
  else {
    _kjCondition.value = *(this_00->wrapped).ptr != '\0';
    if (_kjCondition.value) {
      bVar10 = Input::nextChar(this_00);
      if (bVar10 < 0x5b) {
        if (9 < bVar10 - 0x30) {
          if (bVar10 == 0x22) {
            consumeQuotedString((String *)&_kjCondition,this);
            wVar18.content = __kjCondition;
            if (pSStack_e0 == (SegmentBuilder *)0x0) {
              wVar18.content = (uint64_t)(Exception *)0x54bab9;
            }
            value_01.super_StringPtr.content.size_ =
                 (long)&(pSStack_e0->super_SegmentReader).arena +
                 (ulong)(pSStack_e0 == (SegmentBuilder *)0x0);
            *(undefined2 *)(output->_builder).data = 3;
            f.exception = (Exception *)(output->_builder).segment;
            value_01.super_StringPtr.content.ptr = (char *)wVar18.content;
            capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&f,value_01);
            wVar18.content = __kjCondition;
            if ((Exception *)__kjCondition != (Exception *)0x0) {
              __kjCondition = 0;
              (**(_func_int **)*local_d8)(local_d8,wVar18.content,1,pSStack_e0,pSStack_e0,0);
            }
            goto LAB_002efea5;
          }
          if (bVar10 != 0x2d) goto LAB_002f0847;
        }
        value = (this_00->wrapped).ptr;
        Input::tryConsume(this_00,'-');
        bVar11 = Input::tryConsume(this_00,'0');
        if (!bVar11) {
          cVar12 = Input::nextChar(this_00);
          bVar11 = (byte)(cVar12 - 0x31U) < 9;
          _kjCondition_1.value = bVar11;
          if (!bVar11) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[34]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x25c,FAILED,"predicate(current)",
                       "_kjCondition,\"Unexpected input in JSON message.\"",&_kjCondition_1,
                       (char (*) [34])"Unexpected input in JSON message.");
            kj::_::Debug::Fault::fatal(&f);
          }
          Input::advance(this_00,1);
          while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
                 (cVar12 = Input::nextChar(this_00), (byte)(cVar12 - 0x30U) < 10))) {
            Input::advance(this_00,1);
          }
        }
        bVar11 = Input::tryConsume(this_00,'.');
        if (bVar11) {
          while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
                 (cVar12 = Input::nextChar(this_00), (byte)(cVar12 - 0x30U) < 10))) {
            Input::advance(this_00,1);
          }
        }
        bVar11 = Input::tryConsume(this_00,'e');
        if ((bVar11) || (bVar11 = Input::tryConsume(this_00,'E'), bVar11)) {
          bVar11 = Input::tryConsume(this_00,'+');
          if (!bVar11) {
            Input::tryConsume(this_00,'-');
          }
          while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
                 (cVar12 = Input::nextChar(this_00), (byte)(cVar12 - 0x30U) < 10))) {
            Input::advance(this_00,1);
          }
        }
        f.exception = (Exception *)((this_00->wrapped).ptr + -(long)value);
        if (f.exception == (Exception *)0x0) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                    ((Fault *)&_kjCondition_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x33d,FAILED,"numArrayPtr.size() > 0",
                     "_kjCondition,\"Expected number in JSON input.\"",
                     (DebugComparison<unsigned_long,_int> *)&f,
                     (char (*) [31])"Expected number in JSON input.");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1);
        }
        kj::heapString((String *)&_kjCondition,value,(size_t)f.exception);
        f.exception = (Exception *)__kjCondition;
        if (pSStack_e0 == (SegmentBuilder *)0x0) {
          f.exception = (Exception *)0x54bab9;
        }
        dVar5 = kj::StringPtr::parseAs<double>((StringPtr *)&f);
        wVar18.content = __kjCondition;
        puVar3 = (undefined2 *)(output->_builder).data;
        *puVar3 = 2;
        *(double *)(puVar3 + 4) = dVar5;
        if ((Exception *)__kjCondition != (Exception *)0x0) {
          __kjCondition = 0;
          (**(_func_int **)*local_d8)(local_d8,wVar18.content,1,pSStack_e0,pSStack_e0,0);
        }
      }
      else if (bVar10 < 0x6e) {
        if (bVar10 == 0x5b) {
          fields.builder.ptr = (Orphan<capnp::json::Value::Field> *)0x0;
          fields.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
          fields.builder.endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
          fields.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
          f.exception = (Exception *)(output->_builder).segment;
          pBVar13 = capnp::_::StructBuilder::getArena((StructBuilder *)&f);
          pCVar15 = capnp::_::StructBuilder::getCapTable((StructBuilder *)&f);
          Input::consume(this_00,'[');
          psVar2 = &this->nestingDepth;
          uVar14 = this->nestingDepth + 1;
          this->nestingDepth = uVar14;
          f.exception = (Exception *)psVar2;
          if (this->maxNestingDepth < uVar14) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long_const&>&,char_const(&)[32]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x2ad,FAILED,"++nestingDepth <= maxNestingDepth",
                       "_kjCondition,\"JSON message nested too deeply.\"",
                       (DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)&f,
                       (char (*) [32])"JSON message nested too deeply.");
            kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
          }
          bVar11 = false;
          while( true ) {
            Input::consumeWhitespace(this_00);
            cVar12 = Input::nextChar(this_00);
            if (cVar12 == ']') break;
            capnp::_::OrphanBuilder::initStruct
                      ((OrphanBuilder *)&f,pBVar13,pCVar15,(StructSize)0x10002);
            __kjCondition = (uint64_t)f.exception;
            capnp::_::OrphanBuilder::asStruct
                      ((StructBuilder *)&f,(OrphanBuilder *)&_kjCondition,(StructSize)0x10002);
            if (bVar11) {
              Input::consumeWhitespace(this_00);
              Input::consume(this_00,',');
              Input::consumeWhitespace(this_00);
            }
            parseValue(this,(Builder *)&f);
            if (fields.builder.pos == fields.builder.endPtr) {
              sVar17 = (long)fields.builder.endPtr - (long)fields.builder.ptr >> 4;
              if (fields.builder.endPtr == fields.builder.ptr) {
                sVar17 = 4;
              }
              kj::Vector<capnp::Orphan<capnp::json::Value>_>::setCapacity
                        ((Vector<capnp::Orphan<capnp::json::Value>_> *)&fields,sVar17);
            }
            ((fields.builder.pos)->builder).segment = (SegmentBuilder *)this;
            ((fields.builder.pos)->builder).capTable = (CapTableBuilder *)" <= ";
            ((fields.builder.pos)->builder).location = (word *)&DAT_00000005;
            ((fields.builder.pos)->builder).tag.content = __kjCondition;
            pWStack_d0 = (WirePointer *)0x0;
            fields.builder.pos = fields.builder.pos + 1;
            bVar11 = true;
          }
          *(undefined2 *)(output->_builder).data = 4;
          __kjCondition = (uint64_t)(output->_builder).segment;
          pCVar15 = (output->_builder).capTable;
          pWVar4 = (output->_builder).pointers;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)&f,(PointerBuilder *)&_kjCondition,
                     (ElementCount)
                     ((ulong)((long)fields.builder.pos - (long)fields.builder.ptr) >> 5),
                     (StructSize)0x10002);
          f.exception = (Exception *)(output->_builder).segment;
          capnp::_::PointerBuilder::getStructList
                    ((ListBuilder *)&_kjCondition_1,(PointerBuilder *)&f,(StructSize)0x10002,
                     (word *)0x0);
          lVar21 = (long)fields.builder.pos - (long)fields.builder.ptr;
          if (lVar21 != 0) {
            lVar19 = 0;
            lVar20 = 0;
            do {
              pOVar6 = fields.builder.ptr;
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)&f,(ListBuilder *)&_kjCondition_1,(ElementCount)lVar20);
              capnp::_::OrphanBuilder::asStruct
                        ((StructBuilder *)&_kjCondition,
                         (OrphanBuilder *)((long)&(pOVar6->builder).tag.content + lVar19),
                         (StructSize)0x0);
              other.capTable = pCVar15;
              other.segment = (SegmentBuilder *)__kjCondition;
              other.data = pWVar4;
              other.pointers = pWStack_d0;
              other._32_8_ = local_c8;
              capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&f,other);
              lVar20 = lVar20 + 1;
              lVar19 = lVar19 + 0x20;
            } while (lVar21 >> 5 != lVar20);
          }
          Input::consume(this_00,']');
          pOVar8 = fields.builder.endPtr;
          pRVar7 = fields.builder.pos;
          pOVar6 = fields.builder.ptr;
          *psVar2 = *psVar2 - 1;
          if (fields.builder.ptr != (Orphan<capnp::json::Value::Field> *)0x0) {
            fields.builder.ptr = (Orphan<capnp::json::Value::Field> *)0x0;
            fields.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
            fields.builder.endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
            (**(fields.builder.disposer)->_vptr_ArrayDisposer)
                      (fields.builder.disposer,pOVar6,0x20,(long)pRVar7 - (long)pOVar6 >> 5,
                       (long)pOVar8 - (long)pOVar6 >> 5,
                       kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value>_>::destruct);
          }
        }
        else {
          if (bVar10 != 0x66) {
LAB_002f0847:
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,0x298,FAILED,(char *)0x0,"\"Unexpected input in JSON message.\"",
                       (char (*) [34])"Unexpected input in JSON message.");
            kj::_::Debug::Fault::fatal(&f);
          }
          expected.size_ = 5;
          expected.ptr = "false";
          Input::consume(this_00,expected);
          puVar3 = (undefined2 *)(output->_builder).data;
          *puVar3 = 1;
          pbVar1 = (byte *)(puVar3 + 1);
          *pbVar1 = *pbVar1 & 0xfe;
        }
      }
      else if (bVar10 == 0x6e) {
        expected_01.size_ = 4;
        expected_01.ptr = "null";
        Input::consume(this_00,expected_01);
        *(undefined2 *)(output->_builder).data = 0;
      }
      else if (bVar10 == 0x74) {
        expected_00.size_ = 4;
        expected_00.ptr = "true";
        Input::consume(this_00,expected_00);
        puVar3 = (undefined2 *)(output->_builder).data;
        *puVar3 = 1;
        pbVar1 = (byte *)(puVar3 + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      else {
        if (bVar10 != 0x7b) goto LAB_002f0847;
        fields.builder.ptr = (Orphan<capnp::json::Value::Field> *)0x0;
        fields.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
        fields.builder.endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
        fields.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
        f.exception = (Exception *)(output->_builder).segment;
        pBVar13 = capnp::_::StructBuilder::getArena((StructBuilder *)&f);
        local_38 = capnp::_::StructBuilder::getCapTable((StructBuilder *)&f);
        Input::consume(this_00,'{');
        f.exception = (Exception *)&this->nestingDepth;
        uVar14 = this->nestingDepth + 1;
        this->nestingDepth = uVar14;
        local_40 = (size_t *)f.exception;
        if (this->maxNestingDepth < uVar14) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long_const&>&,char_const(&)[32]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                     ,0x2d0,FAILED,"++nestingDepth <= maxNestingDepth",
                     "_kjCondition,\"JSON message nested too deeply.\"",
                     (DebugComparison<unsigned_long_&,_const_unsigned_long_&> *)&f,
                     (char (*) [32])"JSON message nested too deeply.");
          kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
        }
        bVar11 = false;
        while( true ) {
          Input::consumeWhitespace(this_00);
          cVar12 = Input::nextChar(this_00);
          if (cVar12 == '}') break;
          capnp::_::OrphanBuilder::initStruct
                    ((OrphanBuilder *)&f,pBVar13,local_38,(StructSize)0x20000);
          __kjCondition_1 = (uint64_t)f.exception;
          capnp::_::OrphanBuilder::asStruct
                    ((StructBuilder *)&f,(OrphanBuilder *)&_kjCondition_1,(StructSize)0x20000);
          if (bVar11) {
            Input::consumeWhitespace(this_00);
            Input::consume(this_00,',');
            Input::consumeWhitespace(this_00);
          }
          consumeQuotedString((String *)&local_58,this);
          pEVar16 = (Exception *)0x54bab9;
          if ((Parser *)local_58.capTable != (Parser *)0x0) {
            pEVar16 = (Exception *)local_58.segment;
          }
          value_00.super_StringPtr.content.size_ =
               (long)&(local_58.capTable)->super_CapTableReader +
               (ulong)((Parser *)local_58.capTable == (Parser *)0x0);
          __kjCondition = (uint64_t)f.exception;
          value_00.super_StringPtr.content.ptr = (char *)pEVar16;
          capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&_kjCondition,value_00);
          pCVar15 = local_58.capTable;
          pSVar9 = local_58.segment;
          if ((Exception *)local_58.segment != (Exception *)0x0) {
            local_58.segment = (SegmentBuilder *)0x0;
            local_58.capTable = (CapTableBuilder *)0x0;
            (**(code **)*local_58.pointer)(local_58.pointer,pSVar9,1,pCVar15,pCVar15,0);
          }
          Input::consumeWhitespace(this_00);
          Input::consume(this_00,':');
          Input::consumeWhitespace(this_00);
          local_58.pointer = (WirePointer *)&DAT_0000000d;
          local_58.segment = (SegmentBuilder *)f.exception;
          local_58.capTable = (CapTableBuilder *)this;
          capnp::_::PointerBuilder::getStruct
                    ((StructBuilder *)&_kjCondition,&local_58,(StructSize)0x10002,(word *)0x0);
          parseValue(this,(Builder *)&_kjCondition);
          if (fields.builder.pos == fields.builder.endPtr) {
            sVar17 = (long)fields.builder.endPtr - (long)fields.builder.ptr >> 4;
            if (fields.builder.endPtr == fields.builder.ptr) {
              sVar17 = 4;
            }
            kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::setCapacity(&fields,sVar17);
          }
          ((fields.builder.pos)->builder).segment = (SegmentBuilder *)this;
          ((fields.builder.pos)->builder).capTable = (CapTableBuilder *)" <= ";
          ((fields.builder.pos)->builder).location = (word *)&DAT_00000005;
          ((fields.builder.pos)->builder).tag.content = __kjCondition_1;
          fields.builder.pos = fields.builder.pos + 1;
          bVar11 = true;
        }
        *(undefined2 *)(output->_builder).data = 5;
        __kjCondition = (uint64_t)(output->_builder).segment;
        pCVar15 = (output->_builder).capTable;
        pWVar4 = (output->_builder).pointers;
        capnp::_::PointerBuilder::initStructList
                  ((ListBuilder *)&f,(PointerBuilder *)&_kjCondition,
                   (ElementCount)((ulong)((long)fields.builder.pos - (long)fields.builder.ptr) >> 5)
                   ,(StructSize)0x20000);
        f.exception = (Exception *)(output->_builder).segment;
        capnp::_::PointerBuilder::getStructList
                  ((ListBuilder *)&_kjCondition_1,(PointerBuilder *)&f,(StructSize)0x20000,
                   (word *)0x0);
        lVar21 = (long)fields.builder.pos - (long)fields.builder.ptr;
        if (lVar21 != 0) {
          lVar19 = 0;
          lVar20 = 0;
          do {
            pOVar6 = fields.builder.ptr;
            capnp::_::ListBuilder::getStructElement
                      ((StructBuilder *)&f,(ListBuilder *)&_kjCondition_1,(ElementCount)lVar20);
            capnp::_::OrphanBuilder::asStruct
                      ((StructBuilder *)&_kjCondition,
                       (OrphanBuilder *)((long)&(pOVar6->builder).tag.content + lVar19),
                       (StructSize)0x0);
            other_00.capTable = pCVar15;
            other_00.segment = (SegmentBuilder *)__kjCondition;
            other_00.data = pWVar4;
            other_00.pointers = pWStack_d0;
            other_00._32_8_ = local_c8;
            capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&f,other_00);
            lVar20 = lVar20 + 1;
            lVar19 = lVar19 + 0x20;
          } while (lVar21 >> 5 != lVar20);
        }
        Input::consume(this_00,'}');
        pOVar8 = fields.builder.endPtr;
        pRVar7 = fields.builder.pos;
        pOVar6 = fields.builder.ptr;
        *local_40 = *local_40 - 1;
        if (fields.builder.ptr != (Orphan<capnp::json::Value::Field> *)0x0) {
          fields.builder.ptr = (Orphan<capnp::json::Value::Field> *)0x0;
          fields.builder.pos = (RemoveConst<capnp::Orphan<capnp::json::Value::Field>_> *)0x0;
          fields.builder.endPtr = (Orphan<capnp::json::Value::Field> *)0x0;
          (**(fields.builder.disposer)->_vptr_ArrayDisposer)
                    (fields.builder.disposer,pOVar6,0x20,(long)pRVar7 - (long)pOVar6 >> 5,
                     (long)pOVar8 - (long)pOVar6 >> 5,
                     kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value::Field>_>::
                     destruct);
        }
      }
LAB_002efea5:
      Input::consumeWhitespace(this_00);
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x28c,FAILED,"!input.exhausted()","_kjCondition,\"JSON message ends prematurely.\"",
             &_kjCondition,(char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void parseValue(JsonValue::Builder& output) {
    input.consumeWhitespace();
    KJ_DEFER(input.consumeWhitespace());

    KJ_REQUIRE(!input.exhausted(), "JSON message ends prematurely.");

    switch (input.nextChar()) {
      case 'n': input.consume("null"_kj);  output.setNull();         break;
      case 'f': input.consume("false"_kj); output.setBoolean(false); break;
      case 't': input.consume("true"_kj);  output.setBoolean(true);  break;
      case '"': parseString(output); break;
      case '[': parseArray(output);  break;
      case '{': parseObject(output); break;
      case '-': case '0': case '1': case '2': case '3':
      case '4': case '5': case '6': case '7': case '8':
      case '9': parseNumber(output); break;
      default: KJ_FAIL_REQUIRE("Unexpected input in JSON message.");
    }
  }